

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O3

void fs_write_cb(uv_fs_t *req)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  pvVar2 = malloc(0x80);
  pvVar3 = malloc(0x80);
  pool_events_counter = pool_events_counter + 1;
  uv_fs_req_cleanup(req);
  uVar4 = uv_default_loop();
  iVar1 = uv_queue_work(uVar4,pvVar2,fs_work_cb,fs_after_work_cb);
  if (iVar1 == 0) {
    uVar4 = uv_default_loop();
    iVar1 = uv_queue_work(uVar4,pvVar3,fs_work_cb,fs_after_work_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_write_cb_cold_1();
  }
  fs_write_cb_cold_2();
  uv_fs_req_cleanup();
  pool_events_counter = pool_events_counter + 1;
  return;
}

Assistant:

static void fs_write_cb(uv_fs_t* req) {
  uv_work_t* work1 = malloc(sizeof(*work1));
  uv_work_t* work2 = malloc(sizeof(*work2));
  pool_events_counter++;

  uv_fs_req_cleanup(req);

  ASSERT_OK(uv_queue_work(uv_default_loop(),
                          work1,
                          fs_work_cb,
                          fs_after_work_cb));
  ASSERT_OK(uv_queue_work(uv_default_loop(),
                          work2,
                          fs_work_cb,
                          fs_after_work_cb));
}